

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O3

void __thiscall vec<vec<BoolView>_>::~vec(vec<vec<BoolView>_> *this)

{
  long lVar1;
  ulong uVar2;
  
  if (this->sz != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      vec<BoolView>::~vec((vec<BoolView> *)((long)&this->data->sz + lVar1));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (uVar2 < this->sz);
  }
  if (this->data != (vec<BoolView> *)0x0) {
    free(this->data);
  }
  this->data = (vec<BoolView> *)0x0;
  return;
}

Assistant:

~vec() {
		for (unsigned int i = 0; i < sz; i++) {
			data[i].~T();
		}
		if (data) {
			free(data);
		}
		data = nullptr;
	}